

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQGenerator::Mark(SQGenerator *this,SQCollectable **chain)

{
  SQCollectable_conflict **ppSVar1;
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQUnsignedInteger i;
  SQCollectable_conflict **chain_00;
  SQCollectable_conflict **local_18;
  
  if ((((SQObjectValue *)&(in_RDI->super_SQRefCounted)._uiRef)->nInteger & 0x80000000U) == 0) {
    ((SQObjectValue *)&(in_RDI->super_SQRefCounted)._uiRef)->nInteger =
         ((SQObjectValue *)&(in_RDI->super_SQRefCounted)._uiRef)->nInteger | 0x80000000;
    local_18 = (SQCollectable_conflict **)0x0;
    while( true ) {
      chain_00 = local_18;
      ppSVar1 = (SQCollectable_conflict **)
                sqvector<SQObjectPtr>::size
                          ((sqvector<SQObjectPtr> *)&in_RDI[1].super_SQRefCounted._weakref);
      if (ppSVar1 <= chain_00) break;
      sqvector<SQObjectPtr>::operator[]
                ((sqvector<SQObjectPtr> *)&in_RDI[1].super_SQRefCounted._weakref,
                 (SQUnsignedInteger)local_18);
      SQSharedState::MarkObject((SQObjectPtr *)in_RDI,chain_00);
      local_18 = (SQCollectable_conflict **)((long)local_18 + 1);
    }
    SQSharedState::MarkObject((SQObjectPtr *)in_RDI,chain_00);
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQGenerator::Mark(SQCollectable **chain)
{
    START_MARK()
        for(SQUnsignedInteger i = 0; i < _stack.size(); i++) SQSharedState::MarkObject(_stack[i], chain);
        SQSharedState::MarkObject(_closure, chain);
    END_MARK()
}